

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O2

int loader_impl_metadata_cb_iterate(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  size_t sVar6;
  undefined8 uVar7;
  
  lVar1 = value_create_map(0,2);
  lVar3 = 0;
  if (lVar1 == 0) goto LAB_00107233;
  plVar2 = (long *)value_to_map(lVar1);
  lVar3 = value_create_array(0,2);
  if (lVar3 == 0) {
LAB_00107224:
    *plVar2 = 0;
  }
  else {
    plVar4 = (long *)value_to_array(lVar3);
    lVar5 = value_create_string(&loader_impl_metadata_handle_name_name,4);
    *plVar4 = lVar5;
    if (lVar5 == 0) {
LAB_0010721c:
      value_type_destroy(lVar3);
      goto LAB_00107224;
    }
    sVar6 = strlen((char *)((long)val + 0x18));
    lVar5 = value_create_string((char *)((long)val + 0x18),sVar6);
    plVar4[1] = lVar5;
    if (lVar5 == 0) goto LAB_0010721c;
    *plVar2 = lVar3;
    lVar3 = value_create_array(0,2);
    if (lVar3 != 0) {
      plVar4 = (long *)value_to_array(lVar3);
      lVar5 = value_create_string("scope",5);
      *plVar4 = lVar5;
      if (lVar5 != 0) {
        uVar7 = context_scope(*(undefined8 *)((long)val + 0x1020));
        lVar5 = scope_metadata(uVar7);
        plVar4[1] = lVar5;
        if (lVar5 != 0) {
          plVar2[1] = lVar3;
          lVar3 = lVar1;
          goto LAB_00107233;
        }
      }
      value_type_destroy(lVar3);
    }
    plVar2[1] = 0;
  }
  value_type_destroy(lVar1);
  lVar3 = 0;
LAB_00107233:
  lVar1 = *args;
  *(long *)(*(long *)((long)args + 8) + lVar1 * 8) = lVar3;
  if (*(long *)(*(long *)((long)args + 8) + lVar1 * 8) != 0) {
    *(long *)args = lVar1 + 1;
  }
  return 0;
}

Assistant:

int loader_impl_metadata_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	loader_impl_metadata_cb_iterator metadata_iterator = (loader_impl_metadata_cb_iterator)args;

	(void)s;
	(void)key;

	metadata_iterator->values[metadata_iterator->iterator] = loader_impl_metadata_handle((loader_handle_impl)val);

	if (metadata_iterator->values[metadata_iterator->iterator] != NULL)
	{
		++metadata_iterator->iterator;
	}

	return 0;
}